

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O3

void close_sockets(pmtr_t *cfg)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  UT_array *pUVar4;
  int *piVar5;
  UT_array *pUVar6;
  uint uVar7;
  size_t _ut_i;
  ulong uVar8;
  
  piVar5 = (int *)0x0;
  do {
    pUVar6 = cfg->listen;
    uVar8 = (ulong)pUVar6->i;
    if (piVar5 == (int *)0x0) {
      if (uVar8 == 0) break;
      piVar5 = (int *)pUVar6->d;
    }
    else {
      piVar1 = (int *)pUVar6->d;
      if (piVar5 < piVar1) {
        if (uVar8 == 0) break;
        uVar3 = (pUVar6->icd).sz;
        uVar2 = 0;
      }
      else {
        uVar3 = (pUVar6->icd).sz;
        uVar2 = (ulong)((long)piVar5 - (long)piVar1) / uVar3 + 1;
        if (uVar8 <= uVar2) break;
      }
      piVar5 = (int *)((long)piVar1 + uVar3 * uVar2);
    }
    if (piVar5 == (int *)0x0) break;
    close(*piVar5);
  } while( true );
  piVar5 = (int *)0x0;
  do {
    pUVar6 = cfg->report;
    uVar7 = pUVar6->i;
    if (piVar5 == (int *)0x0) {
      if (uVar7 == 0) {
LAB_00106f04:
        uVar7 = 0;
LAB_00106f06:
        pUVar4 = cfg->listen;
        if (pUVar4->i != 0) {
          if ((pUVar4->icd).dtor != (undefined1 *)0x0) {
            uVar8 = 0;
            do {
              (*(code *)(pUVar4->icd).dtor)(pUVar4->d + (pUVar4->icd).sz * uVar8);
              uVar8 = uVar8 + 1;
              pUVar4 = cfg->listen;
            } while (uVar8 < pUVar4->i);
            pUVar6 = cfg->report;
          }
          pUVar4->i = 0;
          uVar7 = pUVar6->i;
        }
        if (uVar7 != 0) {
          if ((pUVar6->icd).dtor != (undefined1 *)0x0) {
            uVar8 = 0;
            do {
              (*(code *)(pUVar6->icd).dtor)(pUVar6->d + (pUVar6->icd).sz * uVar8);
              uVar8 = uVar8 + 1;
              pUVar6 = cfg->report;
            } while (uVar8 < pUVar6->i);
          }
          pUVar6->i = 0;
        }
        return;
      }
      piVar5 = (int *)pUVar6->d;
    }
    else {
      piVar1 = (int *)pUVar6->d;
      if (piVar5 < piVar1) {
        if (uVar7 == 0) goto LAB_00106f04;
        uVar8 = (pUVar6->icd).sz;
        uVar3 = 0;
      }
      else {
        uVar8 = (pUVar6->icd).sz;
        uVar3 = (ulong)((long)piVar5 - (long)piVar1) / uVar8 + 1;
        if (uVar7 <= uVar3) goto LAB_00106f06;
      }
      piVar5 = (int *)((long)piVar1 + uVar8 * uVar3);
    }
    if (piVar5 == (int *)0x0) goto LAB_00106f06;
    close(*piVar5);
  } while( true );
}

Assistant:

void close_sockets(pmtr_t *cfg) {
  int *fd;
  fd=NULL; while( (fd=(int*)utarray_next(cfg->listen,fd))) close(*fd);
  fd=NULL; while( (fd=(int*)utarray_next(cfg->report,fd))) close(*fd);
  utarray_clear(cfg->listen);
  utarray_clear(cfg->report);
}